

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::analysis::DataFlowState>::
emplaceRealloc<slang::analysis::DataFlowState>
          (SmallVectorBase<slang::analysis::DataFlowState> *this,pointer pos,DataFlowState *args)

{
  ulong uVar1;
  SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL> *pSVar2;
  pointer pDVar3;
  size_type sVar4;
  long lVar5;
  pointer pDVar6;
  DataFlowState *ctx;
  ulong uVar7;
  DataFlowState *other;
  
  if (this->len == 0xcccccccccccccc) {
    detail::throwLengthError();
  }
  uVar7 = this->len + 1;
  uVar1 = this->cap;
  if (uVar7 < uVar1 * 2) {
    uVar7 = uVar1 * 2;
  }
  if (0xcccccccccccccc - uVar1 < uVar1) {
    uVar7 = 0xcccccccccccccc;
  }
  lVar5 = (long)pos - (long)this->data_;
  pDVar3 = (pointer)operator_new(uVar7 * 0xa0);
  ctx = args;
  SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
            ((SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL> *)
             ((long)pDVar3 + lVar5),(Base *)args);
  *(bool *)((long)pDVar3 + lVar5 + 0x98) = args->reachable;
  other = this->data_;
  sVar4 = this->len;
  if (other + sVar4 == pos) {
    pDVar6 = pDVar3;
    if (sVar4 != 0) {
      do {
        ctx = other;
        SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
                  (&pDVar6->assigned,(Base *)other);
        pDVar6->reachable = other->reachable;
        other = other + 1;
        pDVar6 = pDVar6 + 1;
      } while (other != pos);
    }
  }
  else {
    pDVar6 = pDVar3;
    if (other != pos) {
      do {
        ctx = other;
        SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
                  (&pDVar6->assigned,(Base *)other);
        pDVar6->reachable = other->reachable;
        other = other + 1;
        pDVar6 = pDVar6 + 1;
      } while (other != pos);
      other = this->data_;
      sVar4 = this->len;
    }
    if (other + sVar4 != pos) {
      pSVar2 = (SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL> *)
               (lVar5 + (long)pDVar3);
      do {
        ctx = pos;
        SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
                  ((SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL> *)
                   ((long)(pSVar2 + 1) + 8U),(Base *)pos);
        *(bool *)((long)(pSVar2 + 2) + 8) = pos->reachable;
        pos = pos + 1;
        pSVar2 = (SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL> *)
                 ((long)(pSVar2 + 1) + 8U);
      } while (pos != other + sVar4);
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = uVar7;
  this->data_ = pDVar3;
  return (pointer)((long)pDVar3 + lVar5);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}